

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

string * __thiscall Character::HomeString_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  pointer pcVar1;
  Home *pHVar2;
  
  pHVar2 = World::GetHome(this->world,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pHVar2->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pHVar2->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::HomeString() const
{
	return this->world->GetHome(this)->name;
}